

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRangeStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  uint32_t rank;
  bool bVar1;
  Type *pTVar2;
  Result *_result;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  validateInputCount(__return_storage_ptr__,layer,0,0);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    this_00 = &__return_storage_ptr__->m_message;
    std::__cxx11::string::~string((string *)this_00);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)this_00);
      if (0 < (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_) {
        pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                           (&(layer->outputtensor_).super_RepeatedPtrFieldBase,0);
        rank = pTVar2->rank_;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Range",&local_61);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"output",&local_62);
        checkRank(__return_storage_ptr__,layer,&local_40,1,1,&local_60,rank);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_40);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRangeStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 0, 0));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (layer.outputtensor_size() > 0) {
        int rank = static_cast<int>(layer.outputtensor(0).rank());
        HANDLE_RESULT_AND_RETURN_ON_ERROR(checkRank(layer, "Range", 1, 1, "output", rank));
    }

    return Result();
}